

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::changeEvent(QTreeView *this,QEvent *event)

{
  QTreeViewPrivate *this_00;
  
  if ((*(short *)(event + 8) == 100) &&
     (this_00 = *(QTreeViewPrivate **)
                 &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                  super_QWidget.field_0x8, this_00->customIndent == false)) {
    QTreeViewPrivate::updateIndentationFromStyle(this_00);
  }
  QFrame::changeEvent((QFrame *)this,event);
  return;
}

Assistant:

void QTreeView::changeEvent(QEvent *event)
{
    Q_D(QTreeView);
    if (event->type() == QEvent::StyleChange) {
        if (!d->customIndent) {
            // QAbstractItemView calls this method in case of a style change,
            // so update the indentation here if it wasn't set manually.
            d->updateIndentationFromStyle();
        }
    }
    QAbstractItemView::changeEvent(event);
}